

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_prepare_transfer(Curl_easy *data)

{
  connectdata *conn_00;
  anon_union_280_3_6d7b35ba_for_proto *pp;
  char *local_48;
  ftp_conn *ftpc;
  connectdata *conn;
  FTP *ftp;
  CURLcode result;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  if (((data->req).p.file)->fd == 0) {
    if ((*(ulong *)&(data->set).field_0x8ba >> 0xc & 1) == 0) {
      if ((*(ulong *)&(data->set).field_0x8ba >> 0xf & 1) == 0) {
        ftp._4_4_ = ftp_state_use_pasv(data,conn_00);
      }
      else {
        pp = &conn_00->proto;
        if ((conn_00->proto).ftpc.file == (char *)0x0) {
          if ((data->set).str[6] == (char *)0x0) {
            local_48 = "LIST";
            if ((*(uint *)&(data->state).field_0x74c >> 0xf & 1) != 0) {
              local_48 = "NLST";
            }
          }
          else {
            local_48 = (data->set).str[6];
          }
          ftp._4_4_ = Curl_pp_sendf(data,&(pp->ftpc).pp,"PRET %s",local_48);
        }
        else if ((*(uint *)&(data->state).field_0x74c >> 0x14 & 1) == 0) {
          ftp._4_4_ = Curl_pp_sendf(data,&(pp->ftpc).pp,"PRET RETR %s",(conn_00->proto).ftpc.file);
        }
        else {
          ftp._4_4_ = Curl_pp_sendf(data,&(pp->ftpc).pp,"PRET STOR %s",(conn_00->proto).ftpc.file);
        }
        if (ftp._4_4_ == CURLE_OK) {
          _ftp_state(data,'\x1d');
        }
      }
    }
    else {
      ftp._4_4_ = ftp_state_use_port(data,EPRT);
    }
  }
  else {
    _ftp_state(data,'\r');
    ftp._4_4_ = ftp_state_quote(data,true,'\r');
  }
  return ftp._4_4_;
}

Assistant:

static CURLcode ftp_state_prepare_transfer(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;

  if(ftp->transfer != PPTRANSFER_BODY) {
    /* doesn't transfer any data */

    /* still possibly do PRE QUOTE jobs */
    ftp_state(data, FTP_RETR_PREQUOTE);
    result = ftp_state_quote(data, TRUE, FTP_RETR_PREQUOTE);
  }
  else if(data->set.ftp_use_port) {
    /* We have chosen to use the PORT (or similar) command */
    result = ftp_state_use_port(data, EPRT);
  }
  else {
    /* We have chosen (this is default) to use the PASV (or similar) command */
    if(data->set.ftp_use_pret) {
      /* The user has requested that we send a PRET command
         to prepare the server for the upcoming PASV */
      struct ftp_conn *ftpc = &conn->proto.ftpc;
      if(!conn->proto.ftpc.file)
        result = Curl_pp_sendf(data, &ftpc->pp, "PRET %s",
                               data->set.str[STRING_CUSTOMREQUEST]?
                               data->set.str[STRING_CUSTOMREQUEST]:
                               (data->state.list_only?"NLST":"LIST"));
      else if(data->state.upload)
        result = Curl_pp_sendf(data, &ftpc->pp, "PRET STOR %s",
                               conn->proto.ftpc.file);
      else
        result = Curl_pp_sendf(data, &ftpc->pp, "PRET RETR %s",
                               conn->proto.ftpc.file);
      if(!result)
        ftp_state(data, FTP_PRET);
    }
    else
      result = ftp_state_use_pasv(data, conn);
  }
  return result;
}